

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_pathops.cc
# Opt level: O1

string * ctemplate::Basename(string *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  lVar3 = -1;
  pcVar4 = pcVar1 + (path->_M_string_length - 1);
  do {
    pcVar6 = pcVar4;
    lVar5 = lVar3;
    if (pcVar6 < pcVar1) goto LAB_0012e622;
    lVar3 = lVar5 + 1;
    pcVar4 = pcVar6 + -1;
  } while (*pcVar6 != '/');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar6 + 1,pcVar6 + -1 + lVar5 + 3);
  if (pcVar6 < pcVar1) {
LAB_0012e622:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + path->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string Basename(const string& path) {
  for (const char* p = path.data() + path.size()-1; p >= path.data(); --p) {
    if (IsPathSep(*p))
      return string(p+1, path.data() + path.size() - (p+1));
  }
  return path;   // no path-separator found, so whole string is the basename
}